

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall pstack::Exception::Exception(Exception *this,Exception *rhs)

{
  string local_30 [32];
  
  *(undefined ***)this = &PTR__Exception_00107d18;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->str,local_30,_S_out);
  std::__cxx11::string::~string(local_30);
  (this->intermediate)._M_dataplus._M_p = (pointer)&(this->intermediate).field_2;
  (this->intermediate)._M_string_length = 0;
  (this->intermediate).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Exception(const Exception &rhs) noexcept : str{ rhs.str.str() } {}